

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

void lsvm::system::free_process(process *p)

{
  process_t **pppVar1;
  process_t *ppVar2;
  
  current_process = p->next;
  pppVar1 = p->prev;
  if (current_process == (process_t *)0x0) {
    ppVar2 = (process_t *)0x0;
  }
  else {
    current_process->prev = pppVar1;
    ppVar2 = current_process;
  }
  *pppVar1 = ppVar2;
  processes_count = processes_count + -1;
  memory::retain(p);
  return;
}

Assistant:

void free_process(process* p){
    current_process = p->next;
    if(current_process != null)
        current_process->prev = p->prev;
    *(p->prev) = current_process;
    --processes_count;
    lsvm::memory::retain(p);
}